

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.cpp
# Opt level: O1

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,char *oid_str,size_t size)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uchar *__dest;
  uint uVar5;
  size_t sVar6;
  byte bVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  uchar *puVar11;
  size_t __nmemb;
  bool bVar12;
  uchar *out_ptr;
  uchar *local_38;
  
  lVar4 = 0;
  if (size != 0) {
    sVar6 = 0;
    do {
      lVar4 = lVar4 + (ulong)(oid_str[sVar6] == '.');
      sVar6 = sVar6 + 1;
    } while (size != sVar6);
  }
  if (lVar4 - 0x80U < 0xffffffffffffff81) {
    return -0x68;
  }
  local_38 = (uchar *)calloc(lVar4 * 5,1);
  oid->p = local_38;
  if (local_38 == (uchar *)0x0) {
    return -0x6a;
  }
  pbVar1 = (byte *)(oid_str + size);
  if (((long)size < 1) || (bVar7 = *oid_str, 9 < (byte)(bVar7 - 0x30))) {
    uVar2 = 0;
    bVar12 = false;
LAB_00352521:
    pbVar8 = (byte *)oid_str;
    iVar3 = -0x68;
  }
  else {
    lVar9 = size - 1;
    uVar2 = 0;
    do {
      bVar12 = uVar2 < 0x1999999a;
      if (!bVar12) goto LAB_00352521;
      uVar2 = ((uint)bVar7 + uVar2 * 10) - 0x30;
      pbVar8 = pbVar1;
      iVar3 = 0;
      if (lVar9 == 0) break;
      pbVar8 = (byte *)oid_str + 1;
      bVar7 = *pbVar8;
      lVar9 = lVar9 + -1;
      oid_str = (char *)pbVar8;
      iVar3 = 0;
    } while ((byte)(bVar7 - 0x30) < 10);
  }
  if (((bVar12) && (iVar3 = -0x68, pbVar8 < pbVar1 && uVar2 < 3)) && (*pbVar8 == 0x2e)) {
    pbVar10 = pbVar8 + 1;
    if ((pbVar10 < pbVar1) && (bVar7 = *pbVar10, (byte)(bVar7 - 0x30) < 10)) {
      uVar5 = 0;
      pbVar8 = pbVar8 + 2;
      do {
        pbVar10 = pbVar8;
        bVar12 = uVar5 < 0x1999999a;
        if (!bVar12) {
          pbVar10 = pbVar10 + -1;
          iVar3 = -0x68;
          break;
        }
        uVar5 = ((uint)bVar7 + uVar5 * 10) - 0x30;
        iVar3 = 0;
        if (pbVar10 == pbVar1) break;
        bVar7 = *pbVar10;
        pbVar8 = pbVar10 + 1;
        iVar3 = 0;
      } while ((byte)(bVar7 - 0x30) < 10);
    }
    else {
      uVar5 = 0;
      bVar12 = false;
    }
    if ((bVar12) && ((iVar3 = -0x68, 1 < uVar2 || (uVar5 < 0x28)))) {
      if (pbVar10 < pbVar1) {
        if (*pbVar10 != 0x2e) goto LAB_003525f8;
        pbVar10 = pbVar10 + 1;
      }
      if (!CARRY4(uVar2 * 0x28,uVar5)) {
        puVar11 = local_38 + lVar4 * 5;
        iVar3 = oid_subidentifier_encode_into(&local_38,puVar11,uVar2 * 0x28 + uVar5);
        while (iVar3 == 0) {
          if (pbVar1 <= pbVar10) {
            puVar11 = oid->p;
            __nmemb = (long)local_38 - (long)puVar11;
            __dest = (uchar *)calloc(__nmemb,1);
            if (__dest != (uchar *)0x0) {
              switchD_00337d4d::default(__dest,puVar11,__nmemb);
              free(puVar11);
              oid->p = __dest;
              oid->len = __nmemb;
              oid->tag = 6;
              return 0;
            }
            iVar3 = -0x6a;
            break;
          }
          bVar7 = *pbVar10;
          iVar3 = -0x68;
          uVar2 = 0;
          if ((byte)(bVar7 - 0x30) < 10) {
            uVar2 = 0;
            pbVar8 = pbVar10;
            while( true ) {
              pbVar10 = pbVar8 + 1;
              bVar12 = uVar2 < 0x1999999a;
              if (!bVar12) break;
              uVar2 = ((uint)bVar7 + uVar2 * 10) - 0x30;
              iVar3 = 0;
              if ((pbVar10 == pbVar1) ||
                 (bVar7 = *pbVar10, pbVar8 = pbVar10, 9 < (byte)(bVar7 - 0x30))) goto LAB_0035268c;
            }
            iVar3 = -0x68;
            pbVar10 = pbVar8;
          }
          else {
            bVar12 = false;
          }
LAB_0035268c:
          if (!bVar12) break;
          if (pbVar10 < pbVar1) {
            if (*pbVar10 != 0x2e) {
              iVar3 = -0x68;
              break;
            }
            pbVar10 = pbVar10 + 1;
          }
          iVar3 = oid_subidentifier_encode_into(&local_38,puVar11,uVar2);
        }
      }
    }
  }
LAB_003525f8:
  free(oid->p);
  oid->len = 0;
  oid->p = (uchar *)0x0;
  return iVar3;
}

Assistant:

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,
                                    const char *oid_str, size_t size)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
    const char *str_ptr = oid_str;
    const char *str_bound = oid_str + size;
    unsigned int val = 0;
    unsigned int component1, component2;
    size_t encoded_len;
    unsigned char *resized_mem;

    /* Count the number of dots to get a worst-case allocation size. */
    size_t num_dots = 0;
    for (size_t i = 0; i < size; i++) {
        if (oid_str[i] == '.') {
            num_dots++;
        }
    }
    /* Allocate maximum possible required memory:
     * There are (num_dots + 1) integer components, but the first 2 share the
     * same subidentifier, so we only need num_dots subidentifiers maximum. */
    if (num_dots == 0 || (num_dots > MBEDTLS_OID_MAX_COMPONENTS - 1)) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    /* Each byte can store 7 bits, calculate number of bytes for a
     * subidentifier:
     *
     * bytes = ceil(subidentifer_size * 8 / 7)
     */
    size_t bytes_per_subidentifier = (((sizeof(unsigned int) * 8) - 1) / 7)
                                     + 1;
    size_t max_possible_bytes = num_dots * bytes_per_subidentifier;
    oid->p = (unsigned char*) mbedtls_calloc(max_possible_bytes, 1);
    if (oid->p == NULL) {
        return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
    }
    unsigned char *out_ptr = oid->p;
    unsigned char *out_bound = oid->p + max_possible_bytes;

    ret = oid_parse_number(&component1, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if (component1 > 2) {
        /* First component can't be > 2 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr >= str_bound || *str_ptr != '.') {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    str_ptr++;

    ret = oid_parse_number(&component2, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if ((component1 < 2) && (component2 > 39)) {
        /* Root nodes 0 and 1 may have up to 40 children, numbered 0-39 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr < str_bound) {
        if (*str_ptr == '.') {
            str_ptr++;
        } else {
            ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
            goto error;
        }
    }

    if (component2 > (UINT_MAX - (component1 * 40))) {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    ret = oid_subidentifier_encode_into(&out_ptr, out_bound,
                                        (component1 * 40) + component2);
    if (ret != 0) {
        goto error;
    }

    while (str_ptr < str_bound) {
        ret = oid_parse_number(&val, &str_ptr, str_bound);
        if (ret != 0) {
            goto error;
        }
        if (str_ptr < str_bound) {
            if (*str_ptr == '.') {
                str_ptr++;
            } else {
                ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
                goto error;
            }
        }

        ret = oid_subidentifier_encode_into(&out_ptr, out_bound, val);
        if (ret != 0) {
            goto error;
        }
    }

    encoded_len = (size_t) (out_ptr - oid->p);
    resized_mem = (unsigned char*) mbedtls_calloc(encoded_len, 1);
    if (resized_mem == NULL) {
        ret = MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        goto error;
    }
    memcpy(resized_mem, oid->p, encoded_len);
    mbedtls_free(oid->p);
    oid->p = resized_mem;
    oid->len = encoded_len;

    oid->tag = MBEDTLS_ASN1_OID;

    return 0;

error:
    mbedtls_free(oid->p);
    oid->p = NULL;
    oid->len = 0;
    return ret;
}